

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

NewObject * __thiscall
ObjTable<QPDFWriter::NewObject>::element(ObjTable<QPDFWriter::NewObject> *this,size_t idx)

{
  size_t sVar1;
  int iVar2;
  size_type sVar3;
  runtime_error *this_00;
  size_t local_20;
  size_t idx_local;
  ObjTable<QPDFWriter::NewObject> *this_local;
  
  local_20 = idx;
  idx_local = (size_t)this;
  if (element(unsigned_long)::max_size == '\0') {
    iVar2 = __cxa_guard_acquire(&element(unsigned_long)::max_size);
    if (iVar2 != 0) {
      element::max_size =
           std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::max_size
                     (&this->
                       super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>);
      __cxa_guard_release(&element(unsigned_long)::max_size);
    }
  }
  sVar1 = local_20;
  sVar3 = std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::size
                    (&this->
                      super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>);
  if (sVar1 < sVar3) {
    this_local = (ObjTable<QPDFWriter::NewObject> *)
                 std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::
                 operator[](&this->
                             super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                            ,local_20);
  }
  else {
    if (element::max_size <= local_20) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Impossibly large object id encountered accessing ObjTable");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local = (ObjTable<QPDFWriter::NewObject> *)
                 std::
                 map<unsigned_long,_QPDFWriter::NewObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
                 ::at(&this->sparse_elements,&local_20);
  }
  return (NewObject *)this_local;
}

Assistant:

inline T const&
    element(size_t idx) const
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < std::vector<T>::size()) {
            return std::vector<T>::operator[](idx);
        }
        if (idx < max_size) {
            return sparse_elements.at(idx);
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }